

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void * google::protobuf::Arena::AllocFromBlock(Block *b,size_t n)

{
  size_t sVar1;
  
  sVar1 = b->pos;
  b->pos = n + sVar1;
  return (void *)((long)&b->owner + sVar1);
}

Assistant:

void* Arena::AllocFromBlock(Block* b, size_t n) {
  size_t p = b->pos;
  b->pos = p + n;
#ifdef ADDRESS_SANITIZER
  ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b) + p, n);
#endif  // ADDRESS_SANITIZER
  return reinterpret_cast<char*>(b) + p;
}